

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O3

string * tinyusdz::unwrap(string *__return_storage_ptr__,string *str,string *l,string *r)

{
  pointer pcVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long *local_40;
  ulong local_38;
  long local_30 [2];
  
  uVar5 = str->_M_string_length;
  if (r->_M_string_length <= uVar5) {
    lVar4 = std::__cxx11::string::find
                      ((char *)str,(ulong)(r->_M_dataplus)._M_p,uVar5 - r->_M_string_length);
    uVar5 = str->_M_string_length;
    if (lVar4 != -1) {
      std::__cxx11::string::substr((ulong)&local_40,(ulong)str);
      goto LAB_0015e902;
    }
  }
  local_40 = local_30;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,pcVar1,pcVar1 + uVar5);
LAB_0015e902:
  plVar2 = local_40;
  uVar5 = l->_M_string_length;
  if ((local_38 < uVar5) ||
     ((uVar5 != 0 && (iVar3 = bcmp((l->_M_dataplus)._M_p,local_40,uVar5), iVar3 != 0)))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,plVar2,local_38 + (long)plVar2);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_40);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string unwrap(const std::string &str, const std::string &l,
                          const std::string &r) {
  return removePrefix(removeSuffix(str, r), l);
}